

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O1

void __thiscall Ptex::v2_4::PtexSeparableKernel::upresU(PtexSeparableKernel *this)

{
  int iVar1;
  float *pfVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  float fVar6;
  
  iVar1 = this->uw;
  uVar3 = iVar1 * 2;
  if (0 < (long)iVar1) {
    pfVar2 = this->ku;
    iVar4 = iVar1 + 1;
    lVar5 = 0;
    do {
      fVar6 = *(float *)((long)pfVar2 + lVar5 + (long)iVar1 * 4 + -4) * 0.5;
      *(float *)((long)pfVar2 + lVar5 * 2 + (ulong)uVar3 * 4 + -4) = fVar6;
      *(float *)((long)pfVar2 + lVar5 * 2 + (ulong)uVar3 * 4 + -8) = fVar6;
      iVar4 = iVar4 + -1;
      lVar5 = lVar5 + -4;
    } while (1 < iVar4);
  }
  this->uw = uVar3;
  this->u = this->u << 1;
  (this->res).ulog2 = (this->res).ulog2 + '\x01';
  return;
}

Assistant:

void upresU()
    {
        float* src = ku + uw-1;
        float* dst = ku + uw*2-2;
        for (int i = uw; i > 0; i--) {
            dst[0] = dst[1] = *src-- / 2;
            dst -=2;
        }
        uw *= 2;
        u *= 2;
        res.ulog2++;
    }